

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr.c
# Opt level: O2

char * strstr(char *__haystack,char *__needle)

{
  long lVar1;
  char *p1;
  
  do {
    if (*__haystack == '\0') {
      return (char *)0x0;
    }
    lVar1 = 0;
    while( true ) {
      if (__needle[lVar1] == '\0') {
        return __haystack;
      }
      if (__haystack[lVar1] != __needle[lVar1]) break;
      lVar1 = lVar1 + 1;
    }
    __haystack = __haystack + 1;
  } while( true );
}

Assistant:

char * strstr( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *s1 )
    {
        p2 = s2;

        while ( *p2 && ( *p1 == *p2 ) )
        {
            ++p1;
            ++p2;
        }

        if ( ! *p2 )
        {
            return ( char * ) s1;
        }

        ++s1;
        p1 = s1;
    }

    return NULL;
}